

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLDSA.cpp
# Opt level: O3

bool __thiscall OSSLDSA::signFinal(OSSLDSA *this,ByteString *signature)

{
  OSSLDSAPrivateKey *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  DSA *dsa;
  ulong uVar4;
  uchar *puVar5;
  size_t sVar6;
  DSA_SIG *a;
  BIGNUM *bn_s;
  BIGNUM *bn_r;
  ByteString hash;
  ByteString local_50;
  
  this_00 = (OSSLDSAPrivateKey *)(this->super_AsymmetricAlgorithm).currentPrivateKey;
  bVar1 = AsymmetricAlgorithm::signFinal(&this->super_AsymmetricAlgorithm,signature);
  if (!bVar1) {
    return false;
  }
  ByteString::ByteString(&local_50);
  iVar2 = (*this->pCurrentHash->_vptr_HashAlgorithm[4])(this->pCurrentHash,&local_50);
  if (this->pCurrentHash != (HashAlgorithm *)0x0) {
    (*this->pCurrentHash->_vptr_HashAlgorithm[1])();
  }
  this->pCurrentHash = (HashAlgorithm *)0x0;
  if ((char)iVar2 != '\0') {
    dsa = (DSA *)OSSLDSAPrivateKey::getOSSLKey(this_00);
    uVar4 = (**(code **)(*(long *)&this_00->super_DSAPrivateKey + 0x28))(this_00);
    ByteString::resize(signature,uVar4 & 0xffffffff);
    puVar5 = ByteString::operator[](signature,0);
    memset(puVar5,0,uVar4 & 0xffffffff);
    puVar5 = ByteString::operator[](&local_50,0);
    sVar6 = ByteString::size(&local_50);
    a = DSA_do_sign(puVar5,(int)sVar6,dsa);
    if (a != (DSA_SIG *)0x0) {
      DSA_SIG_get0(a);
      iVar3 = BN_num_bits((BIGNUM *)0x0);
      iVar2 = iVar3 + 0xe;
      if (-1 < iVar3 + 7) {
        iVar2 = iVar3 + 7;
      }
      puVar5 = ByteString::operator[]
                         (signature,(ulong)(((uint)(uVar4 >> 1) & 0x7fffffff) - (iVar2 >> 3)));
      BN_bn2bin((BIGNUM *)0x0,puVar5);
      iVar3 = BN_num_bits((BIGNUM *)0x0);
      iVar2 = iVar3 + 0xe;
      if (-1 < iVar3 + 7) {
        iVar2 = iVar3 + 7;
      }
      puVar5 = ByteString::operator[](signature,(ulong)(uint)((int)uVar4 - (iVar2 >> 3)));
      BN_bn2bin((BIGNUM *)0x0,puVar5);
      DSA_SIG_free(a);
      bVar1 = true;
      goto LAB_00153aac;
    }
  }
  bVar1 = false;
LAB_00153aac:
  local_50._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_50.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return bVar1;
}

Assistant:

bool OSSLDSA::signFinal(ByteString& signature)
{
	// Save necessary state before calling super class signFinal
	OSSLDSAPrivateKey* pk = (OSSLDSAPrivateKey*) currentPrivateKey;

	if (!AsymmetricAlgorithm::signFinal(signature))
	{
		return false;
	}

	ByteString hash;

	bool bFirstResult = pCurrentHash->hashFinal(hash);

	delete pCurrentHash;
	pCurrentHash = NULL;

	if (!bFirstResult)
	{
		return false;
	}

	DSA* dsa = pk->getOSSLKey();

	// Perform the signature operation
	unsigned int sigLen = pk->getOutputLength();
	signature.resize(sigLen);
	memset(&signature[0], 0, sigLen);
	DSA_SIG* sig = DSA_do_sign(&hash[0], hash.size(), dsa);
	if (sig == NULL)
		return false;
	// Store the 2 values with padding
	const BIGNUM* bn_r = NULL;
	const BIGNUM* bn_s = NULL;
	DSA_SIG_get0(sig, &bn_r, &bn_s);
	BN_bn2bin(bn_r, &signature[sigLen / 2 - BN_num_bytes(bn_r)]);
	BN_bn2bin(bn_s, &signature[sigLen - BN_num_bytes(bn_s)]);
	DSA_SIG_free(sig);
	return true;
}